

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDualRow.cpp
# Opt level: O1

void __thiscall HEkkDualRow::deleteFreelist(HEkkDualRow *this,HighsInt iVar)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar4;
  HighsInt local_c;
  
  if ((this->freeList)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    p_Var1 = &(this->freeList)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = (this->freeList)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var2 = &p_Var1->_M_header;
    for (; p_Var3 != (_Base_ptr)0x0; p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < iVar]) {
      if (iVar <= (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
    }
    p_Var3 = &p_Var1->_M_header;
    if (((_Rb_tree_header *)p_Var2 != p_Var1) && (p_Var3 = p_Var2, iVar < (int)p_Var2[1]._M_color))
    {
      p_Var3 = &p_Var1->_M_header;
    }
    if ((_Rb_tree_header *)p_Var3 != p_Var1) {
      local_c = iVar;
      pVar4 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
              equal_range(&(this->freeList)._M_t,&local_c);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
      _M_erase_aux(&(this->freeList)._M_t,(_Base_ptr)pVar4.first._M_node,
                   (_Base_ptr)pVar4.second._M_node);
    }
  }
  return;
}

Assistant:

void HEkkDualRow::deleteFreelist(HighsInt iVar) {
  if (!freeList.empty()) {
    if (freeList.count(iVar)) freeList.erase(iVar);
  }
}